

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::GenAccessChainStoreReplacement
          (LocalAccessChainConvertPass *this,Instruction *ptrInst,uint32_t valId,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *newInsts)

{
  IRContext *pIVar1;
  DecorationManager *pDVar2;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *newInsts_00;
  array<signed_char,_4UL> to;
  array<signed_char,_4UL> aVar3;
  pointer pOVar4;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *pdVar5;
  Operand *__cur_2;
  SmallVector<unsigned_int,_2UL> *pSVar6;
  uint32_t index;
  Operand *__cur;
  Operand *__cur_1;
  long lVar7;
  uint32_t varId;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ins_in_opnds;
  uint32_t varPteTypeId;
  array<signed_char,_4UL> local_134;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *local_130;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_128;
  array<signed_char,_4UL> local_110;
  uint32_t local_10c;
  undefined1 local_108 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e8;
  undefined1 local_e0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_c0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_b8;
  undefined1 local_98 [16];
  pointer local_88;
  uint local_80 [2];
  uint *local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined1 local_60 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_40;
  
  index = (ptrInst->has_result_id_ & 1) + 1;
  if (ptrInst->has_type_id_ == false) {
    index = (uint)ptrInst->has_result_id_;
  }
  local_130 = newInsts;
  if ((int)((ulong)((long)(ptrInst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(ptrInst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - index == 1
     ) {
    local_108._16_4_ = Instruction::GetSingleWordOperand(ptrInst,index);
    local_108._24_8_ = local_108 + 0x10;
    local_108._0_8_ = &PTR__SmallVector_00b15d78;
    local_e8._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_108._8_8_ = 1;
    pSVar6 = (SmallVector<unsigned_int,_2UL> *)(local_98 + 8);
    local_98._0_4_ = 1;
    local_98._8_8_ = &PTR__SmallVector_00b15d78;
    local_88 = (pointer)0x0;
    local_78 = local_80;
    local_70 = 0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (pSVar6,(SmallVector<unsigned_int,_2UL> *)local_108);
    local_e0._24_8_ = local_e0 + 0x10;
    local_e0._0_8_ = &PTR__SmallVector_00b15d78;
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_e0._8_8_ = 1;
    local_68 = 1;
    local_60._0_8_ = &PTR__SmallVector_00b15d78;
    local_60._8_8_ = 0;
    local_60._24_8_ = local_60 + 0x10;
    local_40._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_e0._16_4_ = valId;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_60,(SmallVector<unsigned_int,_2UL> *)local_e0
              );
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar7 = 0x60;
    pOVar4 = (pointer)operator_new(0x60);
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar4 + 2;
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = pOVar4;
    do {
      pOVar4->type = *(spv_operand_type_t *)
                      &pSVar6[-1].large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
      (pOVar4->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b15d78;
      (pOVar4->words).size_ = 0;
      (pOVar4->words).small_data_ = (uint *)(pOVar4->words).buffer;
      (pOVar4->words).large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar4->words,pSVar6);
      pOVar4 = pOVar4 + 1;
      pSVar6 = (SmallVector<unsigned_int,_2UL> *)&pSVar6[1].size_;
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != 0);
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = pOVar4;
    BuildAndAppendInst(this,OpStore,0,0,&local_128,local_130);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&local_128);
    lVar7 = -0x60;
    pdVar5 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_40;
    do {
      *(undefined ***)(pdVar5 + -0x20) = &PTR__SmallVector_00b15d78;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar5,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5);
      }
      *(undefined8 *)pdVar5 = 0;
      pdVar5 = pdVar5 + -0x30;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0);
    local_e0._0_8_ = &PTR__SmallVector_00b15d78;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_c0,local_c0._M_head_impl);
    }
    local_108._0_8_ = &PTR__SmallVector_00b15d78;
    if (local_e8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_e8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_e8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
  }
  else {
    to._M_elems = (_Type)BuildAndAppendVarLoad
                                   (this,ptrInst,(uint32_t *)&local_134,&local_10c,newInsts);
    if (to._M_elems == (_Type)0x0) {
      return false;
    }
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    local_110._M_elems = (_Type)valId;
    if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(pIVar1);
    }
    aVar3._M_elems = local_134._M_elems;
    pDVar2 = (pIVar1->decoration_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
             _M_head_impl;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_88 = (pointer)0x0;
    local_98._0_8_ = operator_new(4);
    local_98._8_8_ = local_98._0_8_ + 4;
    *(Decoration *)local_98._0_8_ = DecorationRelaxedPrecision;
    local_88 = (pointer)local_98._8_8_;
    analysis::DecorationManager::CloneDecorations
              (pDVar2,(uint32_t)aVar3._M_elems,(uint32_t)to._M_elems,
               (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_98);
    if ((pointer)local_98._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
    }
    aVar3._M_elems = (_Type)Pass::TakeNextId((Pass *)this);
    if (aVar3._M_elems == (_Type)0x0) {
      return aVar3._M_elems != (_Type)0x0;
    }
    local_108._24_8_ = local_108 + 0x10;
    local_108._0_8_ = &PTR__SmallVector_00b15d78;
    local_e8._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_108[0x10] = local_110._M_elems[0];
    local_108[0x11] = local_110._M_elems[1];
    local_108[0x12] = local_110._M_elems[2];
    local_108[0x13] = local_110._M_elems[3];
    local_108._8_8_ = 1;
    pSVar6 = (SmallVector<unsigned_int,_2UL> *)(local_98 + 8);
    local_98._0_4_ = 1;
    local_98._8_8_ = &PTR__SmallVector_00b15d78;
    local_88 = (pointer)0x0;
    local_78 = local_80;
    local_70 = 0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (pSVar6,(SmallVector<unsigned_int,_2UL> *)local_108);
    local_e0._24_8_ = local_e0 + 0x10;
    local_e0._0_8_ = &PTR__SmallVector_00b15d78;
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_e0._8_8_ = 1;
    local_68 = 1;
    local_60._0_8_ = &PTR__SmallVector_00b15d78;
    local_60._8_8_ = 0;
    local_60._24_8_ = local_60 + 0x10;
    local_40._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_e0._16_4_ = to._M_elems;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_60,(SmallVector<unsigned_int,_2UL> *)local_e0
              );
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar7 = 0x60;
    pOVar4 = (pointer)operator_new(0x60);
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar4 + 2;
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = pOVar4;
    do {
      pOVar4->type = *(spv_operand_type_t *)
                      &pSVar6[-1].large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
      (pOVar4->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b15d78;
      (pOVar4->words).size_ = 0;
      (pOVar4->words).small_data_ = (uint *)(pOVar4->words).buffer;
      (pOVar4->words).large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar4->words,pSVar6);
      pOVar4 = pOVar4 + 1;
      pSVar6 = (SmallVector<unsigned_int,_2UL> *)&pSVar6[1].size_;
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != 0);
    lVar7 = -0x60;
    pdVar5 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_40;
    local_128.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = pOVar4;
    do {
      *(undefined ***)(pdVar5 + -0x20) = &PTR__SmallVector_00b15d78;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar5,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5);
      }
      *(undefined8 *)pdVar5 = 0;
      pdVar5 = pdVar5 + -0x30;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0);
    local_e0._0_8_ = &PTR__SmallVector_00b15d78;
    if (local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_c0,local_c0._M_head_impl);
    }
    newInsts_00 = local_130;
    local_108._0_8_ = &PTR__SmallVector_00b15d78;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_e8._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_e8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_e8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    AppendConstantOperands(this,ptrInst,&local_128);
    BuildAndAppendInst(this,OpCompositeInsert,local_10c,(uint32_t)aVar3._M_elems,&local_128,
                       newInsts_00);
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(pIVar1);
    }
    pDVar2 = (pIVar1->decoration_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
             _M_head_impl;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_88 = (pointer)0x0;
    local_98._0_8_ = operator_new(4);
    local_98._8_8_ = local_98._0_8_ + 4;
    *(Decoration *)local_98._0_8_ = DecorationRelaxedPrecision;
    local_88 = (pointer)local_98._8_8_;
    analysis::DecorationManager::CloneDecorations
              (pDVar2,(uint32_t)local_134._M_elems,(uint32_t)aVar3._M_elems,
               (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_98);
    if ((pointer)local_98._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
    }
    local_108._0_8_ = &PTR__SmallVector_00b15d78;
    local_108._24_8_ = local_108 + 0x10;
    local_e8._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_108[0x10] = local_134._M_elems[0];
    local_108[0x11] = local_134._M_elems[1];
    local_108[0x12] = local_134._M_elems[2];
    local_108[0x13] = local_134._M_elems[3];
    local_108._8_8_ = 1;
    pSVar6 = (SmallVector<unsigned_int,_2UL> *)(local_98 + 8);
    local_98._0_4_ = 1;
    local_98._8_8_ = &PTR__SmallVector_00b15d78;
    local_88 = (pointer)0x0;
    local_78 = local_80;
    local_70 = 0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (pSVar6,(SmallVector<unsigned_int,_2UL> *)local_108);
    local_e0._0_8_ = &PTR__SmallVector_00b15d78;
    local_e0._24_8_ = local_e0 + 0x10;
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_e0._8_8_ = 1;
    local_68 = 1;
    local_60._0_8_ = &PTR__SmallVector_00b15d78;
    local_60._8_8_ = 0;
    local_60._24_8_ = local_60 + 0x10;
    local_40._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_e0._16_4_ = aVar3._M_elems;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_60,(SmallVector<unsigned_int,_2UL> *)local_e0
              );
    local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar7 = 0x60;
    pOVar4 = (pointer)operator_new(0x60);
    local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar4 + 2;
    local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = pOVar4;
    do {
      pOVar4->type = *(spv_operand_type_t *)
                      &pSVar6[-1].large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
      (pOVar4->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b15d78;
      (pOVar4->words).size_ = 0;
      (pOVar4->words).small_data_ = (uint *)(pOVar4->words).buffer;
      (pOVar4->words).large_data_._M_t.
      super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar4->words,pSVar6);
      pOVar4 = pOVar4 + 1;
      pSVar6 = (SmallVector<unsigned_int,_2UL> *)&pSVar6[1].size_;
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != 0);
    local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = pOVar4;
    BuildAndAppendInst(this,OpStore,0,0,&local_b8,local_130);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_b8)
    ;
    lVar7 = -0x60;
    pdVar5 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_40;
    do {
      *(undefined ***)(pdVar5 + -0x20) = &PTR__SmallVector_00b15d78;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar5,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5);
      }
      *(undefined8 *)pdVar5 = 0;
      pdVar5 = pdVar5 + -0x30;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0);
    local_e0._0_8_ = &PTR__SmallVector_00b15d78;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_c0,local_c0._M_head_impl);
    }
    local_108._0_8_ = &PTR__SmallVector_00b15d78;
    if (local_e8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_e8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_e8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&local_128);
  }
  return true;
}

Assistant:

bool LocalAccessChainConvertPass::GenAccessChainStoreReplacement(
    const Instruction* ptrInst, uint32_t valId,
    std::vector<std::unique_ptr<Instruction>>* newInsts) {
  if (ptrInst->NumInOperands() == 1) {
    // An access chain with no indices is essentially a copy.  However, we still
    // have to create a new store because the old ones will be deleted.
    BuildAndAppendInst(
        spv::Op::OpStore, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID,
          {ptrInst->GetSingleWordInOperand(kAccessChainPtrIdInIdx)}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {valId}}},
        newInsts);
    return true;
  }

  // Build and append load of variable in ptrInst
  uint32_t varId;
  uint32_t varPteTypeId;
  const uint32_t ldResultId =
      BuildAndAppendVarLoad(ptrInst, &varId, &varPteTypeId, newInsts);
  if (ldResultId == 0) {
    return false;
  }

  context()->get_decoration_mgr()->CloneDecorations(
      varId, ldResultId, {spv::Decoration::RelaxedPrecision});

  // Build and append Insert
  const uint32_t insResultId = TakeNextId();
  if (insResultId == 0) {
    return false;
  }
  std::vector<Operand> ins_in_opnds = {
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {valId}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {ldResultId}}};
  AppendConstantOperands(ptrInst, &ins_in_opnds);
  BuildAndAppendInst(spv::Op::OpCompositeInsert, varPteTypeId, insResultId,
                     ins_in_opnds, newInsts);

  context()->get_decoration_mgr()->CloneDecorations(
      varId, insResultId, {spv::Decoration::RelaxedPrecision});

  // Build and append Store
  BuildAndAppendInst(spv::Op::OpStore, 0, 0,
                     {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {varId}},
                      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {insResultId}}},
                     newInsts);
  return true;
}